

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::blueprint_helpers::generateIntegerWidthOption
               (int32_t minInt,int32_t maxInt,UnicodeString *sb,UErrorCode *param_4)

{
  UErrorCode *param_3_local;
  UnicodeString *sb_local;
  int32_t maxInt_local;
  int32_t minInt_local;
  
  if (maxInt == -1) {
    UnicodeString::append(sb,L'+');
  }
  else {
    anon_unknown.dwarf_15e376::appendMultiple(sb,0x23,maxInt - minInt);
  }
  anon_unknown.dwarf_15e376::appendMultiple(sb,0x30,minInt);
  return;
}

Assistant:

void blueprint_helpers::generateIntegerWidthOption(int32_t minInt, int32_t maxInt, UnicodeString& sb,
                                                   UErrorCode&) {
    if (maxInt == -1) {
        sb.append(u'+');
    } else {
        appendMultiple(sb, u'#', maxInt - minInt);
    }
    appendMultiple(sb, u'0', minInt);
}